

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::Render(void)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  ImGuiContextHook *pIVar4;
  ImGuiViewportP *pIVar5;
  ImGuiWindow *window;
  ImVec2 IVar6;
  ImGuiContext *pIVar7;
  ImGuiContext *pIVar8;
  ulong uVar9;
  ImDrawList *pIVar10;
  char *__function;
  ImDrawList **ppIVar11;
  ImGuiContext *g;
  int iVar12;
  int iVar13;
  ulong uVar14;
  int n;
  long lVar15;
  ImGuiWindow *pIVar16;
  long lVar17;
  ImGuiWindow *pIVar18;
  ImGuiWindow *windows_to_render_top_most [2];
  ImGuiWindow *local_38 [2];
  
  pIVar7 = GImGui;
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui.cpp"
                  ,0x1171,"void ImGui::Render()");
  }
  if (GImGui->FrameCountEnded != GImGui->FrameCount) {
    EndFrame();
  }
  pIVar7->FrameCountRendered = pIVar7->FrameCount;
  (pIVar7->IO).MetricsRenderWindows = 0;
  if (0 < (pIVar7->Hooks).Size) {
    lVar15 = 0;
    lVar17 = 0;
    do {
      pIVar4 = (pIVar7->Hooks).Data;
      if (*(int *)(pIVar4 + lVar15 + 4) == 4) {
        (**(code **)(pIVar4 + lVar15 + 0x10))(pIVar7);
      }
      lVar17 = lVar17 + 1;
      lVar15 = lVar15 + 0x20;
    } while (lVar17 < (pIVar7->Hooks).Size);
  }
  uVar2 = (pIVar7->Viewports).Size;
  uVar9 = (ulong)uVar2;
  if (uVar2 != 0) {
    uVar14 = 0;
    do {
      if ((long)(int)uVar9 <= (long)uVar14) {
        __function = "T &ImVector<ImGuiViewportP *>::operator[](int) [T = ImGuiViewportP *]";
        goto LAB_001f34bb;
      }
      pIVar5 = (pIVar7->Viewports).Data[uVar14];
      ImDrawDataBuilder::Clear(&pIVar5->DrawDataBuilder);
      if (pIVar5->DrawLists[0] != (ImDrawList *)0x0) {
        pIVar10 = GetViewportDrawList(pIVar5,0,"##Background");
        AddDrawListToDrawData((pIVar5->DrawDataBuilder).Layers,pIVar10);
      }
      uVar14 = uVar14 + 1;
      uVar9 = (ulong)(uint)(pIVar7->Viewports).Size;
    } while (uVar14 != uVar9);
  }
  pIVar18 = pIVar7->NavWindowingTarget;
  if ((pIVar18 == (ImGuiWindow *)0x0) || ((pIVar18->Flags & 0x2000) != 0)) {
    pIVar16 = (ImGuiWindow *)0x0;
  }
  else {
    pIVar16 = pIVar18->RootWindow;
  }
  local_38[0] = pIVar16;
  if (pIVar18 == (ImGuiWindow *)0x0) {
    pIVar18 = (ImGuiWindow *)0x0;
  }
  else {
    pIVar18 = pIVar7->NavWindowingListWindow;
  }
  local_38[1] = pIVar18;
  uVar2 = (pIVar7->Windows).Size;
  uVar9 = (ulong)uVar2;
  if (uVar2 != 0) {
    uVar14 = 0;
    do {
      if ((long)(int)uVar9 <= (long)uVar14) {
        __function = "T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]";
LAB_001f34bb:
        __assert_fail("i >= 0 && i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui.h"
                      ,0x68b,__function);
      }
      window = (pIVar7->Windows).Data[uVar14];
      if ((window->Active == true) && (window->Hidden == false)) {
        if ((window != pIVar18 && window != pIVar16) && (window->Flags & 0x1000000U) == 0) {
          AddWindowToDrawData(window,(uint)window->Flags >> 0x19 & 1);
        }
      }
      uVar14 = uVar14 + 1;
      uVar9 = (ulong)(uint)(pIVar7->Windows).Size;
    } while (uVar14 != uVar9);
  }
  lVar15 = 0;
  do {
    pIVar18 = local_38[lVar15];
    if (((pIVar18 != (ImGuiWindow *)0x0) && (pIVar18->Active == true)) && (pIVar18->Hidden == false)
       ) {
      AddWindowToDrawData(pIVar18,(uint)pIVar18->Flags >> 0x19 & 1);
    }
    lVar15 = lVar15 + 1;
  } while (lVar15 == 1);
  (pIVar7->IO).MetricsRenderVertices = 0;
  (pIVar7->IO).MetricsRenderIndices = 0;
  if (0 < (pIVar7->Viewports).Size) {
    lVar15 = 0;
    do {
      pIVar5 = (pIVar7->Viewports).Data[lVar15];
      ImDrawDataBuilder::FlattenIntoSingleLayer(&pIVar5->DrawDataBuilder);
      if ((pIVar7->IO).MouseDrawCursor == true) {
        pIVar10 = GetViewportDrawList(pIVar5,1,"##Foreground");
        RenderMouseCursor(pIVar10,(pIVar7->IO).MousePos,(pIVar7->Style).MouseCursorScale,
                          pIVar7->MouseCursor,0xffffffff,0xff000000,0x30000000);
      }
      if (pIVar5->DrawLists[1] != (ImDrawList *)0x0) {
        pIVar10 = GetViewportDrawList(pIVar5,1,"##Foreground");
        AddDrawListToDrawData((pIVar5->DrawDataBuilder).Layers,pIVar10);
      }
      pIVar8 = GImGui;
      if (GImGui == (ImGuiContext *)0x0) {
        __assert_fail("GImGui != __null && \"No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?\""
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui.cpp"
                      ,0xd71,"ImGuiIO &ImGui::GetIO()");
      }
      (pIVar5->DrawDataP).Valid = true;
      iVar3 = (pIVar5->DrawDataBuilder).Layers[0].Size;
      if ((long)iVar3 < 1) {
        ppIVar11 = (ImDrawList **)0x0;
      }
      else {
        ppIVar11 = (pIVar5->DrawDataBuilder).Layers[0].Data;
      }
      (pIVar5->DrawDataP).CmdLists = ppIVar11;
      (pIVar5->DrawDataP).CmdListsCount = iVar3;
      (pIVar5->DrawDataP).TotalIdxCount = 0;
      (pIVar5->DrawDataP).TotalVtxCount = 0;
      IVar6 = (pIVar5->super_ImGuiViewport).Size;
      (pIVar5->DrawDataP).DisplayPos = (pIVar5->super_ImGuiViewport).Pos;
      (pIVar5->DrawDataP).DisplaySize = IVar6;
      (pIVar5->DrawDataP).FramebufferScale = (pIVar8->IO).DisplayFramebufferScale;
      if (0 < iVar3) {
        lVar17 = 0;
        iVar12 = 0;
        iVar13 = 0;
        do {
          pIVar10 = (pIVar5->DrawDataBuilder).Layers[0].Data[lVar17];
          iVar13 = iVar13 + (pIVar10->VtxBuffer).Size;
          iVar12 = iVar12 + (pIVar10->IdxBuffer).Size;
          lVar17 = lVar17 + 1;
        } while (iVar3 != lVar17);
        (pIVar5->DrawDataP).TotalVtxCount = iVar13;
        (pIVar5->DrawDataP).TotalIdxCount = iVar12;
      }
      piVar1 = &(pIVar7->IO).MetricsRenderVertices;
      *piVar1 = *piVar1 + (pIVar5->DrawDataP).TotalVtxCount;
      piVar1 = &(pIVar7->IO).MetricsRenderIndices;
      *piVar1 = *piVar1 + (pIVar5->DrawDataP).TotalIdxCount;
      lVar15 = lVar15 + 1;
    } while (lVar15 < (pIVar7->Viewports).Size);
  }
  if (0 < (pIVar7->Hooks).Size) {
    lVar15 = 0;
    lVar17 = 0;
    do {
      pIVar4 = (pIVar7->Hooks).Data;
      if (*(int *)(pIVar4 + lVar15 + 4) == 5) {
        (**(code **)(pIVar4 + lVar15 + 0x10))(pIVar7,pIVar4 + lVar15);
      }
      lVar17 = lVar17 + 1;
      lVar15 = lVar15 + 0x20;
    } while (lVar17 < (pIVar7->Hooks).Size);
  }
  return;
}

Assistant:

void ImGui::Render()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);

    if (g.FrameCountEnded != g.FrameCount)
        EndFrame();
    g.FrameCountRendered = g.FrameCount;
    g.IO.MetricsRenderWindows = 0;

    CallContextHooks(&g, ImGuiContextHookType_RenderPre);

    // Add background ImDrawList (for each active viewport)
    for (int n = 0; n != g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataBuilder.Clear();
        if (viewport->DrawLists[0] != NULL)
            AddDrawListToDrawData(&viewport->DrawDataBuilder.Layers[0], GetBackgroundDrawList(viewport));
    }

    // Add ImDrawList to render
    ImGuiWindow* windows_to_render_top_most[2];
    windows_to_render_top_most[0] = (g.NavWindowingTarget && !(g.NavWindowingTarget->Flags & ImGuiWindowFlags_NoBringToFrontOnFocus)) ? g.NavWindowingTarget->RootWindow : NULL;
    windows_to_render_top_most[1] = (g.NavWindowingTarget ? g.NavWindowingListWindow : NULL);
    for (int n = 0; n != g.Windows.Size; n++)
    {
        ImGuiWindow* window = g.Windows[n];
        IM_MSVC_WARNING_SUPPRESS(6011); // Static Analysis false positive "warning C6011: Dereferencing NULL pointer 'window'"
        if (IsWindowActiveAndVisible(window) && (window->Flags & ImGuiWindowFlags_ChildWindow) == 0 && window != windows_to_render_top_most[0] && window != windows_to_render_top_most[1])
            AddRootWindowToDrawData(window);
    }
    for (int n = 0; n < IM_ARRAYSIZE(windows_to_render_top_most); n++)
        if (windows_to_render_top_most[n] && IsWindowActiveAndVisible(windows_to_render_top_most[n])) // NavWindowingTarget is always temporarily displayed as the top-most window
            AddRootWindowToDrawData(windows_to_render_top_most[n]);

    // Setup ImDrawData structures for end-user
    g.IO.MetricsRenderVertices = g.IO.MetricsRenderIndices = 0;
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataBuilder.FlattenIntoSingleLayer();

        // Draw software mouse cursor if requested by io.MouseDrawCursor flag
        if (g.IO.MouseDrawCursor)
            RenderMouseCursor(GetForegroundDrawList(viewport), g.IO.MousePos, g.Style.MouseCursorScale, g.MouseCursor, IM_COL32_WHITE, IM_COL32_BLACK, IM_COL32(0, 0, 0, 48));

        // Add foreground ImDrawList (for each active viewport)
        if (viewport->DrawLists[1] != NULL)
            AddDrawListToDrawData(&viewport->DrawDataBuilder.Layers[0], GetForegroundDrawList(viewport));

        SetupViewportDrawData(viewport, &viewport->DrawDataBuilder.Layers[0]);
        ImDrawData* draw_data = &viewport->DrawDataP;
        g.IO.MetricsRenderVertices += draw_data->TotalVtxCount;
        g.IO.MetricsRenderIndices += draw_data->TotalIdxCount;
    }

    CallContextHooks(&g, ImGuiContextHookType_RenderPost);
}